

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<int> * __thiscall vector<int>::operator=(vector<int> *this,vector<int> *other)

{
  int iVar1;
  int *piVar2;
  int *__s;
  long lVar3;
  ulong __n;
  
  this->_size = other->_size;
  iVar1 = other->_capacity;
  this->_capacity = iVar1;
  __n = 0xffffffffffffffff;
  if (-1 < (long)iVar1) {
    __n = (long)iVar1 * 4;
  }
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  this->vect = __s;
  iVar1 = this->_size;
  if (0 < (long)iVar1) {
    piVar2 = other->vect;
    lVar3 = 0;
    do {
      __s[lVar3] = piVar2[lVar3];
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }